

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupSelectedOutputs(Gia_Man_t *p,Vec_Int_t *vOutsLeft)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  int iOut;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vOutsLeft_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12e,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManPoNum(p);
  iVar2 = Vec_IntSize(vOutsLeft);
  if (iVar1 < iVar2) {
    __assert_fail("Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12f,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_2c < iVar1) {
      _iOut = Gia_ManCi(p,local_2c);
      bVar6 = _iOut != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _iOut->Value = uVar3;
    local_2c = local_2c + 1;
  }
  for (local_2c = 0; iVar1 = Vec_IntSize(vOutsLeft), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vOutsLeft,local_2c);
    pGVar5 = Gia_ManPo(p,iVar1);
    pGVar5 = Gia_ObjFanin0(pGVar5);
    Gia_ManDupOrderDfs_rec(p_00,p,pGVar5);
  }
  for (local_2c = 0; iVar1 = Vec_IntSize(vOutsLeft), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vOutsLeft,local_2c);
    pGVar5 = Gia_ManPo(p,iVar1);
    iVar1 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p_00,iVar1);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupSelectedOutputs( Gia_Man_t * p, Vec_Int_t * vOutsLeft )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iOut;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(Gia_ManPo(p, iOut)) );
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, iOut)) );
    return pNew;
}